

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O1

int nghttp2_pq_each(nghttp2_pq *pq,nghttp2_pq_item_cb fun,void *arg)

{
  int iVar1;
  ulong uVar2;
  
  if ((pq->length != 0) && (pq->length != 0)) {
    uVar2 = 0;
    do {
      iVar1 = (*fun)(pq->q[uVar2],arg);
      if (iVar1 != 0) {
        return 1;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < pq->length);
  }
  return 0;
}

Assistant:

int nghttp2_pq_each(nghttp2_pq *pq, nghttp2_pq_item_cb fun, void *arg) {
  size_t i;

  if (pq->length == 0) {
    return 0;
  }
  for (i = 0; i < pq->length; ++i) {
    if ((*fun)(pq->q[i], arg)) {
      return 1;
    }
  }
  return 0;
}